

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
IteratorTest_IsOutputIterator_Test::TestBody(IteratorTest_IsOutputIterator_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined8 in_stack_fffffffffffffcc8;
  AssertionResult *pAVar9;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  undefined8 in_stack_fffffffffffffce8;
  int iVar10;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  undefined8 in_stack_fffffffffffffcf8;
  Type TVar11;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  char *in_stack_fffffffffffffd38;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  AssertionResult *in_stack_fffffffffffffd48;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  string local_298 [48];
  AssertionResult local_268;
  string local_258 [48];
  AssertionResult local_228;
  string local_218 [48];
  AssertionResult local_1e8;
  string local_1d8 [48];
  AssertionResult local_1a8;
  string local_198 [48];
  AssertionResult local_168;
  string local_158 [48];
  AssertionResult local_128;
  string local_118 [48];
  AssertionResult local_e8;
  string local_d8 [48];
  AssertionResult local_a8;
  string local_98 [48];
  AssertionResult local_68;
  string local_58 [64];
  AssertionResult local_18;
  
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
  iVar10 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  TVar11 = (Type)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd48,
               (char *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38,
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (Message *)in_stack_fffffffffffffd48);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_58);
    testing::Message::~Message((Message *)0x1227c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12283b);
  this_01 = &local_68;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38,
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_98);
    testing::Message::~Message((Message *)0x122951);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1229c9);
  this_00 = &local_a8;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar3) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd40),&this_00->success_,
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x122ad3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122b4b);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!(bool)uVar4) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd40),&this_00->success_,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_118);
    testing::Message::~Message((Message *)0x122c55);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122ccd);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd40),&this_00->success_,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_158);
    testing::Message::~Message((Message *)0x122dd7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122e4f);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd40),&this_00->success_,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_198);
    testing::Message::~Message((Message *)0x122f59);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122fd1);
  pAVar9 = &local_1a8;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  TVar11 = (Type)((ulong)pAVar9 >> 0x20);
  if (!(bool)uVar5) {
    testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd40),&this_00->success_,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_1d8);
    testing::Message::~Message((Message *)0x1230db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123153);
  pAVar9 = &local_1e8;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  uVar6 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  iVar10 = (int)((ulong)pAVar9 >> 0x20);
  if (!(bool)uVar6) {
    testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd40),&this_00->success_,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(uVar6,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_218);
    testing::Message::~Message((Message *)0x12325d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1232d5);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             (bool)uVar7);
  uVar7 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!(bool)uVar7) {
    testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd40),&this_00->success_,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(uVar6,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(uVar7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_258);
    testing::Message::~Message((Message *)0x1233df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123457);
  pAVar9 = &local_268;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
             SUB81((ulong)pAVar9 >> 0x38,0));
  uVar8 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  if (!(bool)uVar8) {
    testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffd00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (this_01,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd40),&this_00->success_,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffd30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffd00),TVar11,
               (char *)CONCAT17(uVar6,in_stack_fffffffffffffcf0),iVar10,
               (char *)CONCAT17(uVar7,in_stack_fffffffffffffce0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd50),(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar8,in_stack_fffffffffffffcd0));
    std::__cxx11::string::~string(local_298);
    testing::Message::~Message((Message *)0x12355f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1235d7);
  return;
}

Assistant:

TEST(IteratorTest, IsOutputIterator) {
  EXPECT_TRUE(fmt::internal::is_output_iterator<char*>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<const char*>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<std::string>::value);
  EXPECT_TRUE(fmt::internal::is_output_iterator<
              std::back_insert_iterator<std::string>>::value);
  EXPECT_TRUE(fmt::internal::is_output_iterator<
              std::string::iterator>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<
               std::string::const_iterator>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<std::list<char>>::value);
  EXPECT_TRUE(fmt::internal::is_output_iterator<
              std::list<char>::iterator>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<
               std::list<char>::const_iterator>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<uint32_pair>::value);
}